

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

bool __thiscall soul::AST::ArrayElementRef::isResolved(ArrayElementRef *this)

{
  bool bVar1;
  pool_ptr<soul::AST::Expression> local_18;
  pool_ptr<soul::AST::Expression> local_10;
  
  if (this->isSlice == true) {
    bVar1 = isSliceRangeValid(this);
    return bVar1;
  }
  local_10.object = (this->object).object;
  bVar1 = isResolvedAsValue(&local_10);
  if (bVar1) {
    local_18.object = (this->startIndex).object;
    bVar1 = isResolvedAsValue(&local_18);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isResolved() const override
        {
            return isSlice ? isSliceRangeValid()
                           : (isResolvedAsValue (object) && isResolvedAsValue (startIndex));
        }